

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,vector<char,_std::allocator<char>_> *SSD)

{
  KUINT16 *pKVar1;
  long lVar2;
  
  ClearSystemSpecificData(this);
  SetSystemSpecificDataFlag(this,true);
  std::vector<char,_std::allocator<char>_>::operator=(&this->m_vSSD,SSD);
  lVar2 = (long)(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->m_ui8SSDLen = (KUINT8)lVar2;
  pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)lVar2;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const std::vector<KOCTET> & SSD )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD = SSD;
    m_ui8SSDLen = m_vSSD.size();

    // Set the new pdu length
    m_ui16PDULength += m_vSSD.size();
}